

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_delete.c
# Opt level: O1

int zip_delete(zip_t *za,zip_uint64_t idx)

{
  _Bool _Var1;
  int iVar2;
  zip_uint8_t *name;
  
  if (idx < za->nentry) {
    if ((za->ch_flags & 2) == 0) {
      name = (zip_uint8_t *)_zip_get_name(za,idx,0,&za->error);
      if (name == (zip_uint8_t *)0x0) {
        return -1;
      }
      _Var1 = _zip_hash_delete(za->names,name,&za->error);
      if (!_Var1) {
        return -1;
      }
      iVar2 = _zip_unchange(za,idx,1);
      if (iVar2 != 0) {
        return -1;
      }
      za->entry[idx].deleted = true;
      return 0;
    }
    iVar2 = 0x19;
  }
  else {
    iVar2 = 0x12;
  }
  zip_error_set(&za->error,iVar2,0);
  return -1;
}

Assistant:

ZIP_EXTERN int
zip_delete(zip_t *za, zip_uint64_t idx) {
    const char *name;

    if (idx >= za->nentry) {
        zip_error_set(&za->error, ZIP_ER_INVAL, 0);
        return -1;
    }

    if (ZIP_IS_RDONLY(za)) {
        zip_error_set(&za->error, ZIP_ER_RDONLY, 0);
        return -1;
    }

    if ((name = _zip_get_name(za, idx, 0, &za->error)) == NULL) {
        return -1;
    }

    if (!_zip_hash_delete(za->names, (const zip_uint8_t *)name, &za->error)) {
        return -1;
    }

    /* allow duplicate file names, because the file will
     * be removed directly afterwards */
    if (_zip_unchange(za, idx, 1) != 0)
        return -1;

    za->entry[idx].deleted = 1;

    return 0;
}